

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createConstants.cpp
# Opt level: O2

void createConstantsForOperands(User *ins,Program *program)

{
  Value *value;
  Expr *pEVar1;
  User *ins_00;
  Use *op;
  Use *pUVar2;
  const_op_range cVar3;
  
  cVar3 = llvm::User::operands(ins);
  pUVar2 = cVar3.begin_iterator;
  do {
    if (pUVar2 == cVar3.end_iterator) {
      return;
    }
    ins_00 = *(User **)pUVar2;
    if (ins_00[0x10] != (User)0x3) {
      if ((byte)ins_00[0x10] < 0x14) {
        createConstantsForOperands(ins_00,program);
        ins_00 = *(User **)pUVar2;
        if (ins_00 == (User *)0x0) goto LAB_001658e7;
      }
      if ((byte)((Value *)ins_00)[0x10] < 0x14) {
        pEVar1 = Program::getExpr(program,(Value *)ins_00);
        if (pEVar1 == (Expr *)0x0) {
          value = *(Value **)pUVar2;
          pEVar1 = createConstantValue((Value *)ins_00,program);
          Program::addExpr(program,value,pEVar1);
        }
      }
    }
LAB_001658e7:
    pUVar2 = pUVar2 + 0x20;
  } while( true );
}

Assistant:

static void createConstantsForOperands(const llvm::User* ins, Program& program) {
    for (const auto& op : ins->operands()) {

        // assumption: the GV that is an operand of this has already been initialized
        // reason: pass ComputeGlobalVarsOrder has been completed
        if (llvm::isa<llvm::GlobalVariable>(op.get()))
            continue;

        if (auto *user = llvm::dyn_cast_or_null<llvm::User>(op.get())) {
            if (!llvm::isa<llvm::Instruction>(user))
                createConstantsForOperands(user, program);
        }

        if (auto C = llvm::dyn_cast_or_null<llvm::Constant>(op.get())) {
            if (program.getExpr(op.get()) == nullptr)
                program.addExpr(op.get(), createConstantValue(C, program));
        }

    }
}